

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventCount.hpp
# Opt level: O0

Key __thiscall EventCount::prepareWait(EventCount *this)

{
  long *in_RDI;
  uint64_t prev;
  Key local_2c;
  long local_28;
  undefined8 local_20;
  undefined4 local_14;
  undefined8 local_10;
  
  local_10 = 1;
  local_14 = 4;
  local_20 = 1;
  LOCK();
  local_28 = *in_RDI;
  *in_RDI = *in_RDI + 1;
  UNLOCK();
  Key::Key(&local_2c,(uint32_t)((ulong)local_28 >> 0x20));
  return (Key)local_2c.epoch_;
}

Assistant:

inline EventCount::Key EventCount::prepareWait() noexcept {
    uint64_t prev = val_.fetch_add(kAddWaiter, std::memory_order_acq_rel);
    return Key(prev >> kEpochShift);
}